

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O0

void __thiscall
helics::FilterFederate::processDestFilterReturn(FilterFederate *this,ActionMessage *command)

{
  bool bVar1;
  BaseType BVar2;
  action_t aVar3;
  BasicHandleInfo *this_00;
  FilterCoordinator *this_01;
  ActionMessage *in_RSI;
  function<void_(helics::ActionMessage_&&)> *in_RDI;
  FilterCoordinator *filtFunc;
  mapped_type *ongoingDestProcess;
  GlobalFederateId fid;
  uint32_t mid;
  BasicHandleInfo *handle;
  ActionMessage *in_stack_00000288;
  BasicHandleInfo *in_stack_00000290;
  FilterCoordinator *in_stack_00000298;
  FilterFederate *in_stack_000002a0;
  ActionMessage *__args;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  HandleManager *in_stack_ffffffffffffffa0;
  InterfaceHandle in_stack_ffffffffffffffac;
  _Self local_50;
  uint32_t local_44;
  _Self local_40;
  undefined4 in_stack_ffffffffffffffc8;
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *in_stack_ffffffffffffffd0;
  GlobalFederateId local_24;
  uint32_t uVar4;
  BaseType BVar5;
  
  BVar5 = (in_RSI->dest_handle).hid;
  this_00 = HandleManager::getInterfaceHandle
                      (in_stack_ffffffffffffffa0,in_stack_ffffffffffffffac,
                       (InterfaceType)((uint)in_stack_ffffffffffffff9c >> 0x18));
  if (this_00 != (BasicHandleInfo *)0x0) {
    uVar4 = in_RSI->sequenceID;
    local_24 = BasicHandleInfo::getFederateId(this_00);
    __args = (ActionMessage *)&in_RDI[0x21]._M_invoker;
    BVar2 = GlobalFederateId::baseValue(&local_24);
    local_44 = uVar4;
    std::
    map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
    ::operator[](in_stack_ffffffffffffffd0,
                 (key_type_conflict1 *)CONCAT44(BVar2,in_stack_ffffffffffffffc8));
    uVar4 = local_44;
    local_40._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::find
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)
                    CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                    (key_type_conflict1 *)in_RDI);
    local_50._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)__args);
    bVar1 = std::operator==(&local_40,&local_50);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      aVar3 = ActionMessage::action(in_RSI);
      if (aVar3 == cmd_null_dest_message) {
        acceptDestProcessReturn((FilterFederate *)command,this._4_4_,handle._4_4_);
      }
      else {
        BasicHandleInfo::getInterfaceHandle(this_00);
        this_01 = getFilterCoordinator
                            ((FilterFederate *)CONCAT44(BVar5,uVar4),
                             (InterfaceHandle)(BaseType)((ulong)this_00 >> 0x20));
        bVar1 = std::vector<helics::FilterInfo_*,_std::allocator<helics::FilterInfo_*>_>::empty
                          (&this_01->sourceFilters);
        if (!bVar1) {
          runCloningDestinationFilters
                    (in_stack_000002a0,in_stack_00000298,in_stack_00000290,in_stack_00000288);
        }
        ActionMessage::setAction(in_RSI,cmd_send_message);
        std::function<void_(helics::ActionMessage_&&)>::operator()(in_RDI,__args);
        acceptDestProcessReturn((FilterFederate *)command,this._4_4_,handle._4_4_);
      }
    }
  }
  return;
}

Assistant:

void FilterFederate::processDestFilterReturn(ActionMessage& command)
{
    {
        auto* handle = mHandles->getInterfaceHandle(command.dest_handle, InterfaceType::ENDPOINT);
        if (handle == nullptr) {
            return;
        }
        auto mid = command.sequenceID;
        auto fid = handle->getFederateId();

        auto& ongoingDestProcess = ongoingDestFilterProcesses[fid.baseValue()];
        if (ongoingDestProcess.find(mid) != ongoingDestProcess.end()) {
            if (command.action() == CMD_NULL_DEST_MESSAGE) {
                acceptDestProcessReturn(fid, mid);
                return;
            }
            auto* filtFunc = getFilterCoordinator(handle->getInterfaceHandle());

            if (!filtFunc->cloningDestFilters.empty()) {
                runCloningDestinationFilters(filtFunc, handle, command);
            }

            // mCoord->processTimeMessage(command);
            command.setAction(CMD_SEND_MESSAGE);
            mSendMessageMove(std::move(command));
            acceptDestProcessReturn(fid, mid);
        }
    }
}